

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int blech32_convert_bits
              (uint8_t *out,size_t *outlen,int outbits,uint8_t *in,size_t inlen,int inbits,int pad)

{
  size_t sVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  bVar2 = (byte)outbits;
  uVar6 = ~(-1 << (bVar2 & 0x1f));
  if (inlen == 0) {
    if (pad != 0) {
      return 1;
    }
    iVar5 = 0;
    uVar7 = 0;
  }
  else {
    iVar5 = 0;
    uVar7 = 0;
    do {
      uVar7 = (uint)*in | uVar7 << ((byte)inbits & 0x1f);
      iVar5 = iVar5 + inbits;
      while( true ) {
        cVar3 = (char)iVar5;
        bVar4 = (byte)uVar6;
        if (iVar5 < outbits) break;
        iVar5 = iVar5 - outbits;
        sVar1 = *outlen;
        *outlen = sVar1 + 1;
        out[sVar1] = (byte)(uVar7 >> (cVar3 - bVar2 & 0x1f)) & bVar4;
      }
      inlen = inlen - 1;
      in = in + 1;
    } while (inlen != 0);
    if (pad != 0) {
      if (iVar5 == 0) {
        return 1;
      }
      sVar1 = *outlen;
      *outlen = sVar1 + 1;
      out[sVar1] = (byte)(uVar7 << (bVar2 - cVar3 & 0x1f)) & bVar4;
      return 1;
    }
  }
  if (inbits <= iVar5) {
    return 0;
  }
  if ((uVar7 << (bVar2 - (char)iVar5 & 0x1f) & uVar6) == 0) {
    return 1;
  }
  return 0;
}

Assistant:

static int blech32_convert_bits(uint8_t *out, size_t *outlen, int outbits, const uint8_t *in, size_t inlen, int inbits, int pad) {
    uint32_t val = 0;
    int bits = 0;
    uint32_t maxv = (((uint32_t)1) << outbits) - 1;
    while (inlen--) {
        val = (val << inbits) | *(in++);
        bits += inbits;
        while (bits >= outbits) {
            bits -= outbits;
            out[(*outlen)++] = (val >> bits) & maxv;
        }
    }
    if (pad) {
        if (bits) {
            out[(*outlen)++] = (val << (outbits - bits)) & maxv;
        }
    } else if (((val << (outbits - bits)) & maxv) || bits >= inbits) {
        return 0;
    }
    return 1;
}